

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

wchar_t count_interesting_shapes(void)

{
  player_shape **pppVar1;
  int iVar2;
  wchar_t wVar3;
  player_shape *ppVar4;
  
  wVar3 = L'\0';
  ppVar4 = shapes;
  if (shapes != (player_shape *)0x0) {
    do {
      iVar2 = strcmp(ppVar4->name,"normal");
      wVar3 = (wVar3 + L'\x01') - (uint)(iVar2 == 0);
      pppVar1 = &ppVar4->next;
      ppVar4 = *pppVar1;
    } while (*pppVar1 != (player_shape *)0x0);
  }
  return wVar3;
}

Assistant:

static int count_interesting_shapes(void)
{
	int count = 0;
	struct player_shape *s;

	for (s = shapes; s; s = s->next) {
		if (! streq(s->name, "normal")) {
			++count;
		}
	}

	return count;
}